

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O1

CoinSelectionOption * GetElementsOption(void)

{
  CoinSelectionOption *in_RDI;
  
  cfd::CoinSelectionOption::CoinSelectionOption(in_RDI);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_RDI);
  return in_RDI;
}

Assistant:

static CoinSelectionOption GetElementsOption() {
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  return option;
}